

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::anon_unknown_61::ValidatePipelineResourceSignatures
               (PipelineStateCreateInfo *CreateInfo,IRenderDevice *pDevice)

{
  __node_base_ptr *this;
  undefined *puVar1;
  undefined2 uVar2;
  ShaderResourceVariableDesc *pSVar3;
  value_type pIVar4;
  bool bVar5;
  PSO_CREATE_INTERNAL_FLAGS PVar6;
  int iVar7;
  int iVar8;
  SHADER_TYPE SVar9;
  Char *pCVar10;
  undefined8 uVar11;
  undefined4 extraout_var;
  reference ppIVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PipelineResourceDesc *pPVar13;
  pointer ppVar14;
  char **ppcVar15;
  ImmutableSamplerDesc *pIVar16;
  pointer ppVar17;
  reference ppVar18;
  undefined4 extraout_var_02;
  char (*in_RCX) [19];
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false> Args_1;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false> Args_1_00;
  Char **Args_6;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE ShaderStages_00;
  SHADER_TYPE ShaderStages_01;
  SHADER_TYPE ShaderStages_02;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>_>
  pVar19;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>_>
  pVar20;
  ShaderResourceVariableDesc SVar21;
  char *local_920;
  char *local_908;
  char *local_8e8;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false> local_8c8;
  char *local_898;
  char *local_848;
  char *local_828;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false> local_808;
  char *local_7c8;
  char *local_798;
  char *local_750;
  char *local_720;
  char *local_6d8;
  PipelineResourceSignatureDesc *local_6c0;
  __node_base_ptr local_6b0;
  char *local_6a8;
  char *local_698;
  char *local_690;
  char *local_688;
  PSO_CREATE_INTERNAL_FLAGS local_67c;
  char *local_670;
  char *local_668;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false> local_660;
  ImmutableSamplerDesc *local_658;
  ImmutableSamplerDesc *SamDesc_1;
  ImtblSamInfo *local_648;
  char *local_640;
  char *local_638;
  String local_630;
  String local_610;
  char *local_5f0;
  char *local_5e8;
  ImtblSamInfo *local_5e0;
  ImtblSamInfo *SignSam;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false> it_4;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>_>
  range_3;
  char *local_5a8;
  ImmutableSamplerDesc *local_5a0;
  ImmutableSamplerDesc *ImtblSam;
  Char *pCStack_590;
  Uint32 i_2;
  Char *local_588;
  char *local_580;
  char *local_578;
  ShaderResourceVariableDesc local_570;
  Char *local_560;
  ShaderResourceVariableDesc RefDesc;
  PipelineResourceSignatureDesc *SignDesc_1;
  bool VarTypeOK;
  PipelineResourceDesc *ResDesc_1;
  pair<const_Diligent::HashMapStringKey,_ResourceInfo> *it_3;
  iterator __end3;
  iterator __begin3;
  unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
  *__range3;
  Char *local_508;
  Char *local_500;
  char *local_4f8;
  char *local_4f0;
  String local_4e8;
  String local_4c8;
  char *local_4a8;
  char *local_4a0;
  ResourceInfo *local_498;
  ResourceInfo *SignRes;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false> it_2;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>_>
  range_2;
  char *local_460;
  ShaderResourceVariableDesc *local_458;
  ShaderResourceVariableDesc *Var;
  PipelineResourceLayoutDesc *pPStack_448;
  Uint32 i_1;
  PipelineResourceLayoutDesc *ResLayout;
  ImtblSamInfo local_438;
  char *local_420;
  char *local_418;
  undefined1 local_410 [8];
  string msg_11;
  string msg_10;
  char *local_3c8;
  undefined1 local_3c0 [8];
  string msg_9;
  ImtblSamInfo *OtherSam;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false> it_1;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>_>
  range_1;
  string msg_8;
  string msg_7;
  ImmutableSamplerDesc *SamDesc;
  Uint32 res_1;
  ResourceInfo local_318;
  char *local_300;
  char *local_2f8;
  undefined1 local_2f0 [8];
  string msg_6;
  string msg_5;
  char *local_2a8;
  undefined1 local_2a0 [8];
  string msg_4;
  ResourceInfo *OtherRes;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false> it;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>_>
  range;
  string msg_3;
  string msg_2;
  PipelineResourceDesc *ResDesc;
  Uint32 res;
  char *local_1f8;
  undefined1 local_1f0 [8];
  string msg_1;
  PipelineResourceSignatureDesc *SignDesc;
  char *local_1c0;
  value_type local_1b8;
  IPipelineResourceSignature *pSignature;
  undefined1 local_1a8 [4];
  Uint32 i;
  array<const_Diligent::IPipelineResourceSignature_*,_8UL> ppSignatures;
  unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
  AllImtblSamplers;
  unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
  AllResources;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 local_d8 [8];
  string _msg;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  PSO_CREATE_INTERNAL_FLAGS local_84;
  PSO_CREATE_INTERNAL_FLAGS *pPStack_80;
  PSO_CREATE_INTERNAL_FLAGS InternalFlags;
  PSOCreateInternalInfo *pInternalCI;
  PipelineStateDesc *PSODesc;
  DeviceFeatures *Features;
  RenderDeviceInfo *DeviceInfo;
  undefined1 local_50 [8];
  string msg;
  IRenderDevice *pDevice_local;
  PipelineStateCreateInfo *CreateInfo_local;
  
  msg.field_2._8_8_ = pDevice;
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcc143e,
               in_RCX);
    pCVar10 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar10,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xd3);
    std::__cxx11::string::~string((string *)local_50);
  }
  Features = (DeviceFeatures *)(**(code **)(*(long *)msg.field_2._8_8_ + 0xc0))();
  PSODesc = (PipelineStateDesc *)&Features->TimestampQueries;
  pPStack_80 = (PSO_CREATE_INTERNAL_FLAGS *)CreateInfo->pInternalData;
  if (pPStack_80 == (PSO_CREATE_INTERNAL_FLAGS *)0x0) {
    local_67c = PSO_CREATE_INTERNAL_FLAG_NONE;
  }
  else {
    local_67c = *pPStack_80;
  }
  local_84 = local_67c;
  pInternalCI = (PSOCreateInternalInfo *)CreateInfo;
  PVar6 = Diligent::operator&(local_67c,PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0);
  if ((PVar6 != PSO_CREATE_INTERNAL_FLAG_NONE) && (CreateInfo->ResourceSignaturesCount != 1)) {
    local_90 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
    if (*(long *)pInternalCI == 0) {
      local_688 = "";
    }
    else {
      local_688 = *(char **)pInternalCI;
    }
    local_98 = local_688;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[89],unsigned_int,char[13]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xdd,(char (*) [16])"Description of ",&local_90,(char (*) [7])0xc0e54c,&local_98,
               (char (*) [15])"\' is invalid: ",
               (char (*) [89])
               "When PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0 flag is set, ResourceSignaturesCount ("
               ,&CreateInfo->ResourceSignaturesCount,(char (*) [13])") must be 1.");
  }
  if ((CreateInfo->ResourceSignaturesCount != 0) &&
     (CreateInfo->ppResourceSignatures == (IPipelineResourceSignature **)0x0)) {
    local_a0 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
    if (*(long *)pInternalCI == 0) {
      local_690 = "";
    }
    else {
      local_690 = *(char **)pInternalCI;
    }
    local_a8 = local_690;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[60],unsigned_int,char[15]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xe0,(char (*) [16])"Description of ",&local_a0,(char (*) [7])0xc0e54c,&local_a8,
               (char (*) [15])"\' is invalid: ",
               (char (*) [60])"ppResourceSignatures is null, but ResourceSignaturesCount (",
               &CreateInfo->ResourceSignaturesCount,(char (*) [15])") is not zero.");
  }
  if ((CreateInfo->ppResourceSignatures != (IPipelineResourceSignature **)0x0) &&
     (CreateInfo->ResourceSignaturesCount == 0)) {
    local_b0 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
    if (*(long *)pInternalCI == 0) {
      local_698 = "";
    }
    else {
      local_698 = *(char **)pInternalCI;
    }
    _msg.field_2._8_8_ = local_698;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[71]>
              (false,"ValidatePipelineResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0xe3,(char (*) [16])"Description of ",&local_b0,(char (*) [7])0xc0e54c,
               (char **)((long)&_msg.field_2 + 8),(char (*) [15])"\' is invalid: ",
               (char (*) [71])
               "ppResourceSignatures is not null, but ResourceSignaturesCount is zero.");
  }
  if (CreateInfo->ppResourceSignatures != (IPipelineResourceSignature **)0x0) {
    if ((CreateInfo->PSODesc).SRBAllocationGranularity != 1) {
      FormatString<char[135]>
                ((string *)local_d8,
                 (char (*) [135])
                 "PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning."
                );
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(1,uVar11,0);
      }
      std::__cxx11::string::~string((string *)local_d8);
    }
    PVar6 = Diligent::operator&(local_84,PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0);
    if (PVar6 == PSO_CREATE_INTERNAL_FLAG_NONE) {
      if ((CreateInfo->PSODesc).ResourceLayout.NumVariables != 0) {
        local_e0 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
        if (*(long *)pInternalCI == 0) {
          local_6a8 = "";
        }
        else {
          local_6a8 = *(char **)pInternalCI;
        }
        local_e8 = local_6a8;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[58],unsigned_int,char[50]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xf2,(char (*) [16])"Description of ",&local_e0,(char (*) [7])0xc0e54c,&local_e8
                   ,(char (*) [15])"\' is invalid: ",
                   (char (*) [58])"The number of variables defined through resource layout (",
                   &(CreateInfo->PSODesc).ResourceLayout.NumVariables,
                   (char (*) [50])") must be zero when resource signatures are used.");
      }
      if ((CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers != 0) {
        local_f0 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
        if (*(long *)pInternalCI == 0) {
          local_6b0 = (__node_base_ptr)0xc361e0;
        }
        else {
          local_6b0 = *(__node_base_ptr *)pInternalCI;
        }
        AllResources._M_h._M_single_bucket = local_6b0;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[67],unsigned_int,char[50]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xf8,(char (*) [16])"Description of ",&local_f0,(char (*) [7])0xc0e54c,
                   (char **)&AllResources._M_h._M_single_bucket,(char (*) [15])"\' is invalid: ",
                   (char (*) [67])
                   "The number of immutable samplers defined through resource layout (",
                   &(CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers,
                   (char (*) [50])") must be zero when resource signatures are used.");
      }
    }
    std::
    unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
    ::unordered_multimap
              ((unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                *)&AllImtblSamplers._M_h._M_single_bucket);
    std::
    unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
    ::unordered_multimap
              ((unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                *)(ppSignatures._M_elems + 7));
    memset(local_1a8,0,0x40);
    for (pSignature._4_4_ = 0; pSignature._4_4_ < CreateInfo->ResourceSignaturesCount;
        pSignature._4_4_ = pSignature._4_4_ + 1) {
      local_1b8 = CreateInfo->ppResourceSignatures[pSignature._4_4_];
      if (local_1b8 == (value_type)0x0) {
        local_1c0 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
        if (*(long *)pInternalCI == 0) {
          local_6c0 = (PipelineResourceSignatureDesc *)0xc361e0;
        }
        else {
          local_6c0 = *(PipelineResourceSignatureDesc **)pInternalCI;
        }
        SignDesc = local_6c0;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[38],unsigned_int,char[9]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x111,(char (*) [16])"Description of ",&local_1c0,(char (*) [7])0xc0e54c,
                   (char **)&SignDesc,(char (*) [15])"\' is invalid: ",
                   (char (*) [38])"Pipeline resource signature at index ",
                   (uint *)((long)&pSignature + 4),(char (*) [9])0xc37095);
      }
      iVar7 = (*(local_1b8->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg_1.field_2._8_8_ = CONCAT44(extraout_var,iVar7);
      if (7 < *(byte *)(msg_1.field_2._8_8_ + 0x24)) {
        FormatString<char[127]>
                  ((string *)local_1f0,
                   (char (*) [127])
                   "Resource signature binding index exceeds the limit. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc."
                  );
        pCVar10 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar10,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x115);
        std::__cxx11::string::~string((string *)local_1f0);
      }
      ppIVar12 = std::array<const_Diligent::IPipelineResourceSignature_*,_8UL>::operator[]
                           ((array<const_Diligent::IPipelineResourceSignature_*,_8UL> *)local_1a8,
                            (ulong)*(byte *)(msg_1.field_2._8_8_ + 0x24));
      if (*ppIVar12 != (value_type)0x0) {
        local_1f8 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
        if (*(long *)pInternalCI == 0) {
          local_6d8 = "";
        }
        else {
          local_6d8 = *(char **)pInternalCI;
        }
        _res = local_6d8;
        iVar7 = (*(local_1b8->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        ResDesc._4_4_ = (uint)*(byte *)(msg_1.field_2._8_8_ + 0x24);
        ppIVar12 = std::array<const_Diligent::IPipelineResourceSignature_*,_8UL>::operator[]
                             ((array<const_Diligent::IPipelineResourceSignature_*,_8UL> *)local_1a8,
                              (ulong)*(byte *)(msg_1.field_2._8_8_ + 0x24));
        iVar8 = (*((*ppIVar12)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[30],char_const*,char[20],unsigned_int,char[45],char_const*,char[28]>
                  (false,"ValidatePipelineResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x11b,(char (*) [16])"Description of ",&local_1f8,(char (*) [7])0xc0e54c,
                   (char **)&res,(char (*) [15])"\' is invalid: ",
                   (char (*) [30])"Pipeline resource signature \'",
                   (char **)CONCAT44(extraout_var_00,iVar7),(char (*) [20])"\' at binding index ",
                   (uint *)((long)&ResDesc + 4),
                   (char (*) [45])" conflicts with another resource signature \'",
                   (char **)CONCAT44(extraout_var_01,iVar8),
                   (char (*) [28])"\' that uses the same index.");
      }
      pIVar4 = local_1b8;
      ppIVar12 = std::array<const_Diligent::IPipelineResourceSignature_*,_8UL>::operator[]
                           ((array<const_Diligent::IPipelineResourceSignature_*,_8UL> *)local_1a8,
                            (ulong)*(byte *)(msg_1.field_2._8_8_ + 0x24));
      *ppIVar12 = pIVar4;
      for (ResDesc._0_4_ = 0; (uint)ResDesc < *(uint *)(msg_1.field_2._8_8_ + 0x10);
          ResDesc._0_4_ = (uint)ResDesc + 1) {
        pPVar13 = (PipelineResourceDesc *)
                  (*(long *)(msg_1.field_2._8_8_ + 8) + (ulong)(uint)ResDesc * 0x18);
        if ((pPVar13->Name == (char *)0x0) || (*pPVar13->Name == '\0')) {
          FormatString<char[108]>
                    ((string *)((long)&msg_3.field_2 + 8),
                     (char (*) [108])
                     "Resource name can\'t be null or empty. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                    );
          pCVar10 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar10,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x122);
          std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
        }
        if (pPVar13->ShaderStages == SHADER_TYPE_UNKNOWN) {
          FormatString<char[102]>
                    ((string *)&range.second,
                     (char (*) [102])
                     "Shader stages can\'t be UNKNOWN. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                    );
          pCVar10 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar10,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x123);
          std::__cxx11::string::~string((string *)&range.second);
        }
        HashMapStringKey::HashMapStringKey((HashMapStringKey *)&it,pPVar13->Name,false);
        pVar19 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                 ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                                *)&AllImtblSamplers._M_h._M_single_bucket,(key_type *)&it);
        range.first = pVar19.second.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                      ._M_cur;
        Args_1 = pVar19.first.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
        ;
        HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&it);
        OtherRes = (ResourceInfo *)
                   pVar19.first.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
        ;
        while (bVar5 = std::__detail::operator!=
                                 ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                   *)&OtherRes,
                                  (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                   *)&range), bVar5) {
          ppVar14 = std::__detail::
                    _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>
                    ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>
                                  *)&OtherRes);
          msg_4.field_2._8_8_ = &ppVar14->second;
          SVar9 = Diligent::operator&(((ResourceInfo *)msg_4.field_2._8_8_)->Stages,
                                      pPVar13->ShaderStages);
          if (SVar9 != SHADER_TYPE_UNKNOWN) {
            if (*(value_type *)(msg_4.field_2._8_8_ + 8) == local_1b8) {
              FormatString<char[104]>
                        ((string *)local_2a0,
                         (char (*) [104])
                         "Overlapping resources in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              pCVar10 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar10,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,299);
              std::__cxx11::string::~string((string *)local_2a0);
            }
            local_2a8 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
            uVar11 = msg_1.field_2._8_8_;
            if (*(long *)pInternalCI == 0) {
              local_720 = "";
            }
            else {
              local_720 = *(char **)pInternalCI;
            }
            msg_5.field_2._8_8_ = local_720;
            ppcVar15 = (char **)(**(code **)(**(long **)(msg_4.field_2._8_8_ + 8) + 0x20))();
            Args_1._M_cur = (__node_type *)0x12f;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[18],char_const*,char[50],char_const*,char[8],char_const*,char[124]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x12f,(char (*) [16])"Description of ",&local_2a8,(char (*) [7])0xc0e54c,
                       (char **)((long)&msg_5.field_2 + 8),(char (*) [15])"\' is invalid: ",
                       (char (*) [18])"Shader resource \'",(char **)pPVar13,
                       (char (*) [50])"\' is found in more than one resource signature (\'",
                       (char **)uVar11,(char (*) [8])"\' and \'",ppcVar15,
                       (char (*) [124])
                       "\') in the same shader stage. Every shader resource in the PSO must be unambiguously defined by only one resource signature."
                      );
          }
          if (*(char *)&(PSODesc->super_DeviceObjectAttribs).Name == '\0') {
            if (*(int *)msg_4.field_2._8_8_ == 0) {
              FormatString<char[26],char[39]>
                        ((string *)((long)&msg_6.field_2 + 8),
                         (Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"OtherRes.Stages != SHADER_TYPE_UNKNOWN",
                         (char (*) [39])Args_1._M_cur);
              pCVar10 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar10,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x134);
              std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
            }
            if (*(value_type *)(msg_4.field_2._8_8_ + 8) == local_1b8) {
              FormatString<char[111]>
                        ((string *)local_2f0,
                         (char (*) [111])
                         "Resources with the same name in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              pCVar10 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar10,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x135);
              std::__cxx11::string::~string((string *)local_2f0);
            }
            local_2f8 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
            uVar11 = msg_1.field_2._8_8_;
            if (*(long *)pInternalCI == 0) {
              local_750 = "";
            }
            else {
              local_750 = *(char **)pInternalCI;
            }
            local_300 = local_750;
            ppcVar15 = (char **)(**(code **)(**(long **)(msg_4.field_2._8_8_ + 8) + 0x20))();
            Args_1._M_cur = (__node_type *)0x13a;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[71],char_const*,char[50],char_const*,char[8],char_const*,char[206]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x13a,(char (*) [16])"Description of ",&local_2f8,(char (*) [7])0xc0e54c,
                       &local_300,(char (*) [15])"\' is invalid: ",
                       (char (*) [71])
                       "This device does not support separable programs, but shader resource \'",
                       (char **)pPVar13,
                       (char (*) [50])"\' is found in more than one resource signature (\'",
                       (char **)uVar11,(char (*) [8])"\' and \'",ppcVar15,
                       (char (*) [206])
                       "\') in different stages. When separable programs are not supported, every resource is always shared between all stages. Use distinct resource names for each stage or define a single resource for all stages."
                      );
          }
          std::__detail::
          _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>::
          operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>
                      *)&OtherRes);
        }
        local_318.Stages = pPVar13->ShaderStages;
        local_318.pSign = local_1b8;
        local_318.Desc = pPVar13;
        std::
        unordered_multimap<Diligent::HashMapStringKey,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ResourceInfo,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ResourceInfo>>>
        ::
        emplace<char_const*const&,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ResourceInfo>
                  ((unordered_multimap<Diligent::HashMapStringKey,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ResourceInfo,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ResourceInfo>>>
                    *)&AllImtblSamplers._M_h._M_single_bucket,(char **)pPVar13,&local_318);
      }
      for (SamDesc._4_4_ = 0; SamDesc._4_4_ < *(uint *)(msg_1.field_2._8_8_ + 0x20);
          SamDesc._4_4_ = SamDesc._4_4_ + 1) {
        pIVar16 = (ImmutableSamplerDesc *)
                  (*(long *)(msg_1.field_2._8_8_ + 0x18) + (ulong)SamDesc._4_4_ * 0x48);
        if ((pIVar16->SamplerOrTextureName == (Char *)0x0) ||
           (*pIVar16->SamplerOrTextureName == '\0')) {
          FormatString<char[107]>
                    ((string *)((long)&msg_8.field_2 + 8),
                     (char (*) [107])
                     "Sampler name can\'t be null or empty. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                    );
          pCVar10 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar10,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x143);
          std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
        }
        if (pIVar16->ShaderStages == SHADER_TYPE_UNKNOWN) {
          FormatString<char[101]>
                    ((string *)&range_1.second,
                     (char (*) [101])
                     "Shader stage can\'t be UNKNOWN. This should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                    );
          pCVar10 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar10,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x144);
          std::__cxx11::string::~string((string *)&range_1.second);
        }
        HashMapStringKey::HashMapStringKey
                  ((HashMapStringKey *)&it_1,pIVar16->SamplerOrTextureName,false);
        pVar20 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                 ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                                *)(ppSignatures._M_elems + 7),(key_type *)&it_1);
        range_1.first =
             pVar20.second.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
             ._M_cur;
        Args_1_00 = pVar20.first.
                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
        ;
        HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&it_1);
        OtherSam = (ImtblSamInfo *)
                   pVar20.first.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
        ;
        while (bVar5 = std::__detail::operator!=
                                 ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                   *)&OtherSam,
                                  (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                   *)&range_1), bVar5) {
          ppVar17 = std::__detail::
                    _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>
                    ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>
                                  *)&OtherSam);
          msg_9.field_2._8_8_ = &ppVar17->second;
          SVar9 = Diligent::operator&(((ImtblSamInfo *)msg_9.field_2._8_8_)->Stages,
                                      pIVar16->ShaderStages);
          if (SVar9 != SHADER_TYPE_UNKNOWN) {
            if (*(value_type *)(msg_9.field_2._8_8_ + 8) == local_1b8) {
              FormatString<char[113]>
                        ((string *)local_3c0,
                         (char (*) [113])
                         "Overlapping immutable samplers in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              pCVar10 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar10,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x14c);
              std::__cxx11::string::~string((string *)local_3c0);
            }
            local_3c8 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
            uVar11 = msg_1.field_2._8_8_;
            if (*(long *)pInternalCI == 0) {
              local_798 = "";
            }
            else {
              local_798 = *(char **)pInternalCI;
            }
            msg_10.field_2._8_8_ = local_798;
            ppcVar15 = (char **)(**(code **)(**(long **)(msg_9.field_2._8_8_ + 8) + 0x20))();
            Args_1_00._M_cur = (__node_type *)0x150;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[20],char_const*,char[50],char_const*,char[8],char_const*,char[119]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x150,(char (*) [16])"Description of ",&local_3c8,(char (*) [7])0xc0e54c,
                       (char **)((long)&msg_10.field_2 + 8),(char (*) [15])"\' is invalid: ",
                       (char (*) [20])"Immutable sampler \'",&pIVar16->SamplerOrTextureName,
                       (char (*) [50])"\' is found in more than one resource signature (\'",
                       (char **)uVar11,(char (*) [8])"\' and \'",ppcVar15,
                       (char (*) [119])
                       "\') in the same stage. Every immutable sampler in the PSO must be unambiguously defined by only one resource signature."
                      );
          }
          if (*(char *)&(PSODesc->super_DeviceObjectAttribs).Name == '\0') {
            if (*(int *)msg_9.field_2._8_8_ == 0) {
              FormatString<char[26],char[39]>
                        ((string *)((long)&msg_11.field_2 + 8),
                         (Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"OtherSam.Stages != SHADER_TYPE_UNKNOWN",
                         (char (*) [39])Args_1_00._M_cur);
              pCVar10 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar10,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x155);
              std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
            }
            if (*(value_type *)(msg_9.field_2._8_8_ + 8) == local_1b8) {
              FormatString<char[120]>
                        ((string *)local_410,
                         (char (*) [120])
                         "Immutable samplers with the same name in one signature should\'ve been caught by ValidatePipelineResourceSignatureDesc()"
                        );
              pCVar10 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar10,"ValidatePipelineResourceSignatures",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x156);
              std::__cxx11::string::~string((string *)local_410);
            }
            local_418 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
            uVar11 = msg_1.field_2._8_8_;
            if (*(long *)pInternalCI == 0) {
              local_7c8 = "";
            }
            else {
              local_7c8 = *(char **)pInternalCI;
            }
            local_420 = local_7c8;
            ppcVar15 = (char **)(**(code **)(**(long **)(msg_9.field_2._8_8_ + 8) + 0x20))();
            Args_1_00._M_cur = (__node_type *)0x15b;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[73],char_const*,char[50],char_const*,char[8],char_const*,char[215]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x15b,(char (*) [16])"Description of ",&local_418,(char (*) [7])0xc0e54c,
                       &local_420,(char (*) [15])"\' is invalid: ",
                       (char (*) [73])
                       "This device does not support separable programs, but immutable sampler \'",
                       &pIVar16->SamplerOrTextureName,
                       (char (*) [50])"\' is found in more than one resource signature (\'",
                       (char **)uVar11,(char (*) [8])"\' and \'",ppcVar15,
                       (char (*) [215])
                       "\') in different stages. When separable programs are not supported, every resource is always shared between all stages. Use distinct resource names for each stage or define a single immutable sampler for all stages."
                      );
          }
          std::__detail::
          _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>::
          operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>
                      *)&OtherSam);
        }
        local_438.Stages = pIVar16->ShaderStages;
        local_438.pSign = local_1b8;
        local_438.Desc = pIVar16;
        ResLayout = (PipelineResourceLayoutDesc *)
                    std::
                    unordered_multimap<Diligent::HashMapStringKey,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ImtblSamInfo,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ImtblSamInfo>>>
                    ::
                    emplace<char_const*const&,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ImtblSamInfo>
                              ((unordered_multimap<Diligent::HashMapStringKey,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ImtblSamInfo,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::(anonymous_namespace)::ValidatePipelineResourceSignatures(Diligent::PipelineStateCreateInfo_const&,Diligent::IRenderDevice_const*)::ImtblSamInfo>>>
                                *)(ppSignatures._M_elems + 7),&pIVar16->SamplerOrTextureName,
                               &local_438);
      }
    }
    PVar6 = Diligent::operator&(local_84,PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0);
    SVar21.ShaderStages = local_570.ShaderStages;
    SVar21.Type = local_570.Type;
    SVar21.Flags = local_570.Flags;
    SVar21._14_2_ = local_570._14_2_;
    SVar21.Name = local_570.Name;
    if (PVar6 != PSO_CREATE_INTERNAL_FLAG_NONE) {
      bVar5 = RenderDeviceInfo::IsGLDevice((RenderDeviceInfo *)Features);
      SVar21.ShaderStages = local_570.ShaderStages;
      SVar21.Type = local_570.Type;
      SVar21.Flags = local_570.Flags;
      SVar21._14_2_ = local_570._14_2_;
      SVar21.Name = local_570.Name;
      if (!bVar5) {
        pPStack_448 = &(CreateInfo->PSODesc).ResourceLayout;
        for (Var._4_4_ = 0; Var._4_4_ < pPStack_448->NumVariables; Var._4_4_ = Var._4_4_ + 1) {
          local_458 = pPStack_448->Variables + Var._4_4_;
          if (local_458->Name == (Char *)0x0) {
            local_460 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
            if (*(long *)pInternalCI == 0) {
              local_808._M_cur = (__node_type *)0xc361e0;
            }
            else {
              local_808._M_cur = *(__node_type **)pInternalCI;
            }
            range_2.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                       )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                         )local_808._M_cur;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[15]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x16c,(char (*) [16])"Description of ",&local_460,(char (*) [7])0xc0e54c,
                       (char **)&range_2.second,(char (*) [15])"\' is invalid: ",
                       (char (*) [26])"ResourceLayout.Variables[",(uint *)((long)&Var + 4),
                       (char (*) [15])"].Name is null");
          }
          HashMapStringKey::HashMapStringKey((HashMapStringKey *)&it_2,local_458->Name,false);
          pVar19 = std::
                   unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                   ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                                  *)&AllImtblSamplers._M_h._M_single_bucket,(key_type *)&it_2);
          range_2.first =
               pVar19.second.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
               ._M_cur;
          HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&it_2);
          SignRes = (ResourceInfo *)
                    pVar19.first.
                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
          ;
          while (bVar5 = std::__detail::operator!=
                                   ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                     *)&SignRes,
                                    (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                                     *)&range_2), bVar5) {
            ppVar14 = std::__detail::
                      _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>
                      ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>
                                    *)&SignRes);
            local_498 = &ppVar14->second;
            SVar9 = Diligent::operator&(local_498->Stages,local_458->ShaderStages);
            if (SVar9 != SHADER_TYPE_UNKNOWN) {
              if (local_498->Stages != local_458->ShaderStages) {
                local_4a0 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
                pSVar3 = local_458;
                if (*(long *)pInternalCI == 0) {
                  local_828 = "";
                }
                else {
                  local_828 = *(char **)pInternalCI;
                }
                local_4a8 = local_828;
                GetShaderStagesString_abi_cxx11_
                          (&local_4c8,(Diligent *)(ulong)local_458->ShaderStages,ShaderStages);
                GetShaderStagesString_abi_cxx11_
                          (&local_4e8,(Diligent *)(ulong)local_498->Stages,ShaderStages_00);
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[28],char_const*,char[35],std::__cxx11::string,char[71],std::__cxx11::string,char[73]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x17a,(char (*) [16])"Description of ",&local_4a0,(char (*) [7])0xc0e54c
                           ,&local_4a8,(char (*) [15])"\' is invalid: ",
                           (char (*) [28])"Shader stages of variable \'",&pSVar3->Name,
                           (char (*) [35])"\' defined by the resource layout (",&local_4c8,
                           (char (*) [71])
                           ") do not match the stages defined by the implicit resource signature (",
                           &local_4e8,
                           (char (*) [73])
                           "). This might indicate a bug in the serialization/deserialization logic."
                          );
                std::__cxx11::string::~string((string *)&local_4e8);
                std::__cxx11::string::~string((string *)&local_4c8);
              }
              if (local_498->Desc->VarType != local_458->Type) {
                local_4f0 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
                pSVar3 = local_458;
                if (*(long *)pInternalCI == 0) {
                  local_848 = "";
                }
                else {
                  local_848 = *(char **)pInternalCI;
                }
                local_4f8 = local_848;
                local_500 = GetShaderVariableTypeLiteralName(local_458->Type,false);
                local_508 = GetShaderVariableTypeLiteralName(local_498->Desc->VarType,false);
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[35],char_const*,char[71],char_const*,char[73]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x181,(char (*) [16])"Description of ",&local_4f0,(char (*) [7])0xc0e54c
                           ,&local_4f8,(char (*) [15])"\' is invalid: ",
                           (char (*) [23])"The type of variable \'",&pSVar3->Name,
                           (char (*) [35])"\' defined by the resource layout (",&local_500,
                           (char (*) [71])
                           ") does not match the type defined by the implicit resource signature (",
                           &local_508,
                           (char (*) [73])
                           "). This might indicate a bug in the serialization/deserialization logic."
                          );
              }
              break;
            }
            std::__detail::
            _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>
            ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>
                          *)&SignRes);
          }
          bVar5 = std::__detail::operator==
                            ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                              *)&SignRes,
                             (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                              *)&range_2);
          if (!bVar5) {
            std::
            unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
            ::erase((unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                     *)&AllImtblSamplers._M_h._M_single_bucket,(iterator)SignRes);
          }
        }
        this = &AllImtblSamplers._M_h._M_single_bucket;
        __end3 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                 ::begin((unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                          *)this);
        it_3 = (pair<const_Diligent::HashMapStringKey,_ResourceInfo> *)
               std::
               unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
               ::end((unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                      *)this);
        while( true ) {
          bVar5 = std::__detail::operator!=
                            (&__end3.
                              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                             ,(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false>
                               *)&it_3);
          if (!bVar5) break;
          ppVar18 = std::__detail::
                    _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>
                    ::operator*(&__end3);
          pPVar13 = (ppVar18->second).Desc;
          bVar5 = pPVar13->VarType == pPStack_448->DefaultVariableType;
          SVar21 = local_570;
          if ((!bVar5) && (pPVar13->ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)) {
            iVar7 = (*(((ppVar18->second).pSign)->super_IDeviceObject).super_IObject._vptr_IObject
                      [4])();
            RefDesc._8_8_ = CONCAT44(extraout_var_02,iVar7);
            SVar21 = local_570;
            if ((*(byte *)(RefDesc._8_8_ + 0x25) & 1) != 0) {
              SVar21 = FindPipelineResourceLayoutVariable
                                 ((PipelineResourceLayoutDesc *)(pInternalCI + 6),pPVar13->Name,
                                  pPVar13->ShaderStages,*(char **)(RefDesc._8_8_ + 0x28));
              local_560 = SVar21.Name;
              local_570.ShaderStages = SVar21.ShaderStages;
              RefDesc.Name._0_4_ = local_570.ShaderStages;
              local_570._12_2_ = SVar21._12_2_;
              RefDesc.Name._4_1_ = local_570.Type;
              RefDesc.Name._5_1_ = local_570.Flags;
              uVar2 = RefDesc.Name._4_2_;
              RefDesc.Name._4_1_ = SVar21.Type;
              bVar5 = RefDesc.Name._4_1_ == pPVar13->VarType;
              RefDesc.Name._4_2_ = uVar2;
            }
          }
          local_570 = SVar21;
          if (!bVar5) {
            local_578 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
            if (*(long *)pInternalCI == 0) {
              local_898 = "";
            }
            else {
              local_898 = *(char **)pInternalCI;
            }
            local_580 = local_898;
            local_588 = GetShaderVariableTypeLiteralName(pPVar13->VarType,false);
            pCStack_590 = GetShaderVariableTypeLiteralName(pPStack_448->DefaultVariableType,false);
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[23],char_const*,char[50],char_const*,char[45],char_const*,char[73]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1a4,(char (*) [16])"Description of ",&local_578,(char (*) [7])0xc0e54c,
                       &local_580,(char (*) [15])"\' is invalid: ",
                       (char (*) [23])"The type of variable \'",&pPVar13->Name,
                       (char (*) [50])"\' not explicitly defined by the resource layout (",
                       &local_588,(char (*) [45])") does not match the default variable type (",
                       &stack0xfffffffffffffa70,
                       (char (*) [73])
                       "). This might indicate a bug in the serialization/deserialization logic.");
          }
          std::__detail::
          _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>,_false,_false>::
          operator++(&__end3);
        }
        for (ImtblSam._4_4_ = 0; ImtblSam._4_4_ < pPStack_448->NumImmutableSamplers;
            ImtblSam._4_4_ = ImtblSam._4_4_ + 1) {
          local_5a0 = pPStack_448->ImmutableSamplers + ImtblSam._4_4_;
          if (local_5a0->SamplerOrTextureName == (Char *)0x0) {
            local_5a8 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
            if (*(long *)pInternalCI == 0) {
              local_8c8._M_cur = (__node_type *)0xc361e0;
            }
            else {
              local_8c8._M_cur = *(__node_type **)pInternalCI;
            }
            range_3.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                       )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                         )local_8c8._M_cur;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[31]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1ac,(char (*) [16])"Description of ",&local_5a8,(char (*) [7])0xc0e54c,
                       (char **)&range_3.second,(char (*) [15])"\' is invalid: ",
                       (char (*) [34])"ResourceLayout.ImmutableSamplers[",
                       (uint *)((long)&ImtblSam + 4),(char (*) [31])"].SamplerOrTextureName is null"
                      );
          }
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&it_4,local_5a0->SamplerOrTextureName,false);
          pVar20 = std::
                   unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                   ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                                  *)(ppSignatures._M_elems + 7),(key_type *)&it_4);
          range_3.first =
               pVar20.second.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
               ._M_cur;
          HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&it_4);
          SignSam = (ImtblSamInfo *)
                    pVar20.first.
                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
          ;
          while( true ) {
            bVar5 = std::__detail::operator!=
                              ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                *)&SignSam,
                               (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                                *)&range_3);
            if (!bVar5) break;
            ppVar17 = std::__detail::
                      _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>
                      ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>
                                    *)&SignSam);
            local_5e0 = &ppVar17->second;
            SVar9 = Diligent::operator&(local_5e0->Stages,local_5a0->ShaderStages);
            if (SVar9 != SHADER_TYPE_UNKNOWN) {
              if (local_5e0->Stages != local_5a0->ShaderStages) {
                local_5e8 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
                if (*(long *)pInternalCI == 0) {
                  local_8e8 = "";
                }
                else {
                  local_8e8 = *(char **)pInternalCI;
                }
                local_5f0 = local_8e8;
                Args_6 = &local_5a0->SamplerOrTextureName;
                GetShaderStagesString_abi_cxx11_
                          (&local_610,(Diligent *)(ulong)local_5a0->ShaderStages,ShaderStages_01);
                GetShaderStagesString_abi_cxx11_
                          (&local_630,(Diligent *)(ulong)local_5a0->ShaderStages,ShaderStages_02);
                LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[37],char_const*,char[35],std::__cxx11::string,char[70],std::__cxx11::string,char[73]>
                          (false,"ValidatePipelineResourceSignatures",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x1b9,(char (*) [16])"Description of ",&local_5e8,(char (*) [7])0xc0e54c
                           ,&local_5f0,(char (*) [15])"\' is invalid: ",
                           (char (*) [37])"Shader stages of immutable sampler \'",Args_6,
                           (char (*) [35])"\' defined by the resource layout (",&local_610,
                           (char (*) [70])
                           ") do not match the stages defined by the implicit resource signatre (",
                           &local_630,
                           (char (*) [73])
                           "). This might indicate a bug in the serialization/deserialization logic."
                          );
                std::__cxx11::string::~string((string *)&local_630);
                std::__cxx11::string::~string((string *)&local_610);
              }
              break;
            }
            std::__detail::
            _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>
            ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>
                          *)&SignSam);
          }
          bVar5 = std::__detail::operator==
                            ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                              *)&SignSam,
                             (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false>
                              *)&range_3);
          if (bVar5) {
            local_638 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
            if (*(long *)pInternalCI == 0) {
              local_908 = "";
            }
            else {
              local_908 = *(char **)pInternalCI;
            }
            local_640 = local_908;
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[45],char_const*,char[58],char[70]>
                      (false,"ValidatePipelineResourceSignatures",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x1c1,(char (*) [16])"Description of ",&local_638,(char (*) [7])0xc0e54c,
                       &local_640,(char (*) [15])"\' is invalid: ",
                       (char (*) [45])"Resource layout contains immutable sampler \'",
                       &local_5a0->SamplerOrTextureName,
                       (char (*) [58])"\' that is not present in the implicit resource signatre. ",
                       (char (*) [70])0xcc90c4);
          }
          local_648 = SignSam;
          SamDesc_1 = (ImmutableSamplerDesc *)
                      std::
                      unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                      ::erase((unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                               *)(ppSignatures._M_elems + 7),(iterator)SignSam);
        }
        bVar5 = std::
                unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                ::empty((unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                         *)(ppSignatures._M_elems + 7));
        SVar21 = local_570;
        if (!bVar5) {
          local_660._M_cur =
               (__node_type *)
               std::
               unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
               ::begin((unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                        *)(ppSignatures._M_elems + 7));
          ppVar17 = std::__detail::
                    _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>
                    ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>,_false,_false>
                                  *)&local_660);
          local_658 = (ppVar17->second).Desc;
          local_668 = GetPipelineTypeString((PIPELINE_TYPE)pInternalCI[2].Flags);
          if (*(long *)pInternalCI == 0) {
            local_920 = "";
          }
          else {
            local_920 = *(char **)pInternalCI;
          }
          local_670 = local_920;
          LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[57],char_const*,char[47],char[70]>
                    (false,"ValidatePipelineResourceSignatures",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x1ca,(char (*) [16])"Description of ",&local_668,(char (*) [7])0xc0e54c,
                     &local_670,(char (*) [15])"\' is invalid: ",
                     (char (*) [57])"Implicit resource signature contains immutable sampler \'",
                     &local_658->SamplerOrTextureName,
                     (char (*) [47])"\' that is not present in the resource layout. ",
                     (char (*) [70])0xcc90c4);
          SVar21 = local_570;
        }
      }
    }
    local_570 = SVar21;
    std::
    unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
    ::~unordered_multimap
              ((unordered_multimap<Diligent::HashMapStringKey,_ImtblSamInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ImtblSamInfo>_>_>
                *)(ppSignatures._M_elems + 7));
    std::
    unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
    ::~unordered_multimap
              ((unordered_multimap<Diligent::HashMapStringKey,_ResourceInfo,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_ResourceInfo>_>_>
                *)&AllImtblSamplers._M_h._M_single_bucket);
  }
  return;
}

Assistant:

void ValidatePipelineResourceSignatures(const PipelineStateCreateInfo& CreateInfo,
                                        const IRenderDevice*           pDevice) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    const RenderDeviceInfo& DeviceInfo = pDevice->GetDeviceInfo();
    const DeviceFeatures&   Features   = DeviceInfo.Features;

    const PipelineStateDesc& PSODesc = CreateInfo.PSODesc;

    const PSOCreateInternalInfo*    pInternalCI   = static_cast<const PSOCreateInternalInfo*>(CreateInfo.pInternalData);
    const PSO_CREATE_INTERNAL_FLAGS InternalFlags = pInternalCI != nullptr ? pInternalCI->Flags : PSO_CREATE_INTERNAL_FLAG_NONE;

    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0 && CreateInfo.ResourceSignaturesCount != 1)
        LOG_PSO_ERROR_AND_THROW("When PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0 flag is set, ResourceSignaturesCount (", CreateInfo.ResourceSignaturesCount, ") must be 1.");

    if (CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures == nullptr)
        LOG_PSO_ERROR_AND_THROW("ppResourceSignatures is null, but ResourceSignaturesCount (", CreateInfo.ResourceSignaturesCount, ") is not zero.");

    if (CreateInfo.ppResourceSignatures != nullptr && CreateInfo.ResourceSignaturesCount == 0)
        LOG_PSO_ERROR_AND_THROW("ppResourceSignatures is not null, but ResourceSignaturesCount is zero.");

    if (CreateInfo.ppResourceSignatures == nullptr)
        return;

    if (CreateInfo.PSODesc.SRBAllocationGranularity != 1)
    {
        LOG_WARNING_MESSAGE("PSODesc.SRBAllocationGranularity is ignored when explicit resource signatures are used. Use default value (1) to silence this warning.");
    }

    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
    {
        if (CreateInfo.PSODesc.ResourceLayout.NumVariables != 0)
        {
            LOG_PSO_ERROR_AND_THROW("The number of variables defined through resource layout (", CreateInfo.PSODesc.ResourceLayout.NumVariables,
                                    ") must be zero when resource signatures are used.");
        }

        if (CreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers != 0)
        {
            LOG_PSO_ERROR_AND_THROW("The number of immutable samplers defined through resource layout (", CreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers,
                                    ") must be zero when resource signatures are used.");
        }
    }

    struct ResourceInfo
    {
        const SHADER_TYPE                 Stages;
        const IPipelineResourceSignature* pSign;
        const PipelineResourceDesc&       Desc;
    };
    struct ImtblSamInfo
    {
        const SHADER_TYPE                 Stages;
        const IPipelineResourceSignature* pSign;
        const ImmutableSamplerDesc&       Desc;
    };

    std::unordered_multimap<HashMapStringKey, ResourceInfo> AllResources;
    std::unordered_multimap<HashMapStringKey, ImtblSamInfo> AllImtblSamplers;

    std::array<const IPipelineResourceSignature*, MAX_RESOURCE_SIGNATURES> ppSignatures = {};
    for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
    {
        const IPipelineResourceSignature* const pSignature = CreateInfo.ppResourceSignatures[i];
        if (pSignature == nullptr)
            LOG_PSO_ERROR_AND_THROW("Pipeline resource signature at index ", i, " is null");

        const PipelineResourceSignatureDesc& SignDesc = pSignature->GetDesc();
        VERIFY(SignDesc.BindingIndex < MAX_RESOURCE_SIGNATURES,
               "Resource signature binding index exceeds the limit. This error should've been caught by ValidatePipelineResourceSignatureDesc.");

        if (ppSignatures[SignDesc.BindingIndex] != nullptr)
        {
            LOG_PSO_ERROR_AND_THROW("Pipeline resource signature '", pSignature->GetDesc().Name, "' at binding index ", Uint32{SignDesc.BindingIndex},
                                    " conflicts with another resource signature '", ppSignatures[SignDesc.BindingIndex]->GetDesc().Name,
                                    "' that uses the same index.");
        }
        ppSignatures[SignDesc.BindingIndex] = pSignature;

        for (Uint32 res = 0; res < SignDesc.NumResources; ++res)
        {
            const PipelineResourceDesc& ResDesc = SignDesc.Resources[res];
            VERIFY(ResDesc.Name != nullptr && ResDesc.Name[0] != '\0', "Resource name can't be null or empty. This should've been caught by ValidatePipelineResourceSignatureDesc()");
            VERIFY(ResDesc.ShaderStages != SHADER_TYPE_UNKNOWN, "Shader stages can't be UNKNOWN. This should've been caught by ValidatePipelineResourceSignatureDesc()");

            auto range = AllResources.equal_range(ResDesc.Name);
            for (auto it = range.first; it != range.second; ++it)
            {
                const ResourceInfo& OtherRes = it->second;
                if ((OtherRes.Stages & ResDesc.ShaderStages) != 0)
                {
                    VERIFY(OtherRes.pSign != pSignature, "Overlapping resources in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("Shader resource '", ResDesc.Name, "' is found in more than one resource signature ('", SignDesc.Name,
                                            "' and '", OtherRes.pSign->GetDesc().Name,
                                            "') in the same shader stage. Every shader resource in the PSO must be unambiguously defined by only one resource signature.");
                }

                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(OtherRes.Stages != SHADER_TYPE_UNKNOWN);
                    VERIFY(OtherRes.pSign != pSignature, "Resources with the same name in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but shader resource '", ResDesc.Name, "' is found in more than one resource signature ('",
                                            SignDesc.Name, "' and '", OtherRes.pSign->GetDesc().Name,
                                            "') in different stages. When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single resource for all stages.");
                }
            }
            AllResources.emplace(ResDesc.Name, ResourceInfo{ResDesc.ShaderStages, pSignature, ResDesc});
        }

        for (Uint32 res = 0; res < SignDesc.NumImmutableSamplers; ++res)
        {
            const ImmutableSamplerDesc& SamDesc = SignDesc.ImmutableSamplers[res];
            VERIFY(SamDesc.SamplerOrTextureName != nullptr && SamDesc.SamplerOrTextureName[0] != '\0', "Sampler name can't be null or empty. This should've been caught by ValidatePipelineResourceSignatureDesc()");
            VERIFY(SamDesc.ShaderStages != SHADER_TYPE_UNKNOWN, "Shader stage can't be UNKNOWN. This should've been caught by ValidatePipelineResourceSignatureDesc()");

            auto range = AllImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);
            for (auto it = range.first; it != range.second; ++it)
            {
                const ImtblSamInfo& OtherSam = it->second;
                if ((OtherSam.Stages & SamDesc.ShaderStages) != 0)
                {
                    VERIFY(OtherSam.pSign != pSignature, "Overlapping immutable samplers in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("Immutable sampler '", SamDesc.SamplerOrTextureName, "' is found in more than one resource signature ('", SignDesc.Name,
                                            "' and '", OtherSam.pSign->GetDesc().Name,
                                            "') in the same stage. Every immutable sampler in the PSO must be unambiguously defined by only one resource signature.");
                }

                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(OtherSam.Stages != SHADER_TYPE_UNKNOWN);
                    VERIFY(OtherSam.pSign != pSignature, "Immutable samplers with the same name in one signature should've been caught by ValidatePipelineResourceSignatureDesc()");

                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but immutable sampler '", SamDesc.SamplerOrTextureName, "' is found in more than one resource signature ('",
                                            SignDesc.Name, "' and '", OtherSam.pSign->GetDesc().Name,
                                            "') in different stages. When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single immutable sampler for all stages.");
                }
            }
            AllImtblSamplers.emplace(SamDesc.SamplerOrTextureName, ImtblSamInfo{SamDesc.ShaderStages, pSignature, SamDesc});
        }
    }


    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0 &&
        // Deserialized default signatures are empty in OpenGL.
        !DeviceInfo.IsGLDevice())
    {
        const PipelineResourceLayoutDesc& ResLayout = CreateInfo.PSODesc.ResourceLayout;
        for (Uint32 i = 0; i < ResLayout.NumVariables; ++i)
        {
            const ShaderResourceVariableDesc& Var = ResLayout.Variables[i];
            if (Var.Name == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name is null");

            auto range = AllResources.equal_range(Var.Name);
            auto it    = range.first;
            for (; it != range.second; ++it)
            {
                const ResourceInfo& SignRes = it->second;
                if ((SignRes.Stages & Var.ShaderStages) == 0)
                    continue;

                if (SignRes.Stages != Var.ShaderStages)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader stages of variable '", Var.Name, "' defined by the resource layout (", GetShaderStagesString(Var.ShaderStages),
                                            ") do not match the stages defined by the implicit resource signature (", GetShaderStagesString(SignRes.Stages),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                if (SignRes.Desc.VarType != Var.Type)
                {
                    LOG_PSO_ERROR_AND_THROW("The type of variable '", Var.Name, "' defined by the resource layout (", GetShaderVariableTypeLiteralName(Var.Type),
                                            ") does not match the type defined by the implicit resource signature (", GetShaderVariableTypeLiteralName(SignRes.Desc.VarType),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                break;
            }

            if (it == range.second)
            {
                // It is OK - there may be variables in the resource layout
                // that don't present in any shader.
            }
            else
            {
                AllResources.erase(it);
            }
        }
        for (const auto& it : AllResources)
        {
            const PipelineResourceDesc& ResDesc = it.second.Desc;

            bool VarTypeOK = ResDesc.VarType == ResLayout.DefaultVariableType;
            if (!VarTypeOK && ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
            {
                const PipelineResourceSignatureDesc& SignDesc = it.second.pSign->GetDesc();
                if (SignDesc.UseCombinedTextureSamplers)
                {
                    const ShaderResourceVariableDesc RefDesc = FindPipelineResourceLayoutVariable(PSODesc.ResourceLayout, ResDesc.Name, ResDesc.ShaderStages, SignDesc.CombinedSamplerSuffix);
                    // The type of the immutable sampler must match the type of the texture variable it is assigned to
                    VarTypeOK = RefDesc.Type == ResDesc.VarType;
                }
            }
            if (!VarTypeOK)
            {
                LOG_PSO_ERROR_AND_THROW("The type of variable '", ResDesc.Name, "' not explicitly defined by the resource layout (", GetShaderVariableTypeLiteralName(ResDesc.VarType),
                                        ") does not match the default variable type (", GetShaderVariableTypeLiteralName(ResLayout.DefaultVariableType),
                                        "). This might indicate a bug in the serialization/deserialization logic.");
            }
        }

        for (Uint32 i = 0; i < ResLayout.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& ImtblSam = ResLayout.ImmutableSamplers[i];
            if (ImtblSam.SamplerOrTextureName == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName is null");
            auto range = AllImtblSamplers.equal_range(ImtblSam.SamplerOrTextureName);
            auto it    = range.first;
            for (; it != range.second; ++it)
            {
                const ImtblSamInfo& SignSam = it->second;
                if ((SignSam.Stages & ImtblSam.ShaderStages) == 0)
                    continue;

                if (SignSam.Stages != ImtblSam.ShaderStages)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader stages of immutable sampler '", ImtblSam.SamplerOrTextureName, "' defined by the resource layout (", GetShaderStagesString(ImtblSam.ShaderStages),
                                            ") do not match the stages defined by the implicit resource signatre (", GetShaderStagesString(ImtblSam.ShaderStages),
                                            "). This might indicate a bug in the serialization/deserialization logic.");
                }

                break;
            }
            if (it == range.second)
            {
                LOG_PSO_ERROR_AND_THROW("Resource layout contains immutable sampler '", ImtblSam.SamplerOrTextureName, "' that is not present in the implicit resource signatre. ",
                                        "This might indicate a bug in the serialization/deserialization logic.");
            }

            AllImtblSamplers.erase(it);
        }
        if (!AllImtblSamplers.empty())
        {
            const ImmutableSamplerDesc& SamDesc = AllImtblSamplers.begin()->second.Desc;
            LOG_PSO_ERROR_AND_THROW("Implicit resource signature contains immutable sampler '", SamDesc.SamplerOrTextureName, "' that is not present in the resource layout. ",
                                    "This might indicate a bug in the serialization/deserialization logic.");
        }
    }
}